

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoRcc.cxx
# Opt level: O0

string * __thiscall
cmQtAutoRcc::MultiConfigOutput_abi_cxx11_(string *__return_storage_ptr__,cmQtAutoRcc *this)

{
  int iVar1;
  string local_50;
  undefined1 local_2d;
  allocator<char> local_19;
  cmQtAutoRcc *local_18;
  cmQtAutoRcc *this_local;
  string *res;
  
  local_18 = this;
  this_local = (cmQtAutoRcc *)__return_storage_ptr__;
  if ((MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_), iVar1 != 0))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_,"_CMAKE_",&local_19);
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::__cxx11::string::~string,&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
  }
  local_2d = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)&this->RccPathChecksum_);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  cmQtAutoGen::AppendFilenameSuffix
            (&local_50,&this->RccFileName_,&MultiConfigOutput[abi:cxx11]()::suffix_abi_cxx11_);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoRcc::MultiConfigOutput() const
{
  static std::string const suffix = "_CMAKE_";
  std::string res;
  res += RccPathChecksum_;
  res += '/';
  res += AppendFilenameSuffix(RccFileName_, suffix);
  return res;
}